

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode connect_SOCKS(connectdata *conn,int sockindex,_Bool *done)

{
  uint local_5c;
  uint local_58;
  uint local_54;
  char *local_50;
  char *local_48;
  char *local_40;
  int port;
  char *host;
  CURLproxycode pxresult;
  CURLcode result;
  _Bool *done_local;
  int sockindex_local;
  connectdata *conn_local;
  
  host._4_4_ = CURLE_OK;
  host._0_4_ = CURLPX_OK;
  if ((*(ulong *)&(conn->bits).field_0x4 >> 1 & 1) == 0) {
    *done = true;
  }
  else {
    if ((*(ulong *)&(conn->bits).field_0x4 & 1) == 0) {
      if ((*(ulong *)&(conn->bits).field_0x4 >> 8 & 1) == 0) {
        if (sockindex == 1) {
          local_50 = conn->secondaryhostname;
        }
        else {
          local_50 = (conn->host).name;
        }
        local_48 = local_50;
      }
      else {
        local_48 = (conn->conn_to_host).name;
      }
      local_40 = local_48;
    }
    else {
      local_40 = (conn->http_proxy).host.name;
    }
    if ((*(ulong *)&(conn->bits).field_0x4 & 1) == 0) {
      if (sockindex == 1) {
        local_58 = (uint)conn->secondary_port;
      }
      else {
        if ((*(ulong *)&(conn->bits).field_0x4 >> 9 & 1) == 0) {
          local_5c = conn->remote_port;
        }
        else {
          local_5c = conn->conn_to_port;
        }
        local_58 = local_5c;
      }
      local_54 = local_58;
    }
    else {
      local_54 = (uint)(conn->http_proxy).port;
    }
    switch((conn->socks_proxy).proxytype) {
    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      host._0_4_ = Curl_SOCKS4((conn->socks_proxy).user,local_40,local_54,sockindex,conn,done);
      break;
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      host._0_4_ = Curl_SOCKS5((conn->socks_proxy).user,(conn->socks_proxy).passwd,local_40,local_54
                               ,sockindex,conn,done);
      break;
    default:
      Curl_failf(conn->data,"unknown proxytype option given");
      host._4_4_ = CURLE_COULDNT_CONNECT;
    }
    if ((CURLproxycode)host != CURLPX_OK) {
      host._4_4_ = CURLE_PROXY;
      (conn->data->info).pxcode = (CURLproxycode)host;
    }
  }
  return host._4_4_;
}

Assistant:

static CURLcode connect_SOCKS(struct connectdata *conn, int sockindex,
                              bool *done)
{
  CURLcode result = CURLE_OK;
#ifndef CURL_DISABLE_PROXY
  CURLproxycode pxresult = CURLPX_OK;
  if(conn->bits.socksproxy) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    const int port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      pxresult = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                             host, port, sockindex, conn, done);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      pxresult = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                             conn, done);
      break;

    default:
      failf(conn->data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    if(pxresult) {
      result = CURLE_PROXY;
      conn->data->info.pxcode = pxresult;
    }
  }
  else
#else
    (void)conn;
    (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
    *done = TRUE; /* no SOCKS proxy, so consider us connected */

  return result;
}